

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_pool.hpp
# Opt level: O2

void __thiscall iutest::detail::iuPool::push(iuPool *this,value_ptr ptr)

{
  value_ptr local_8;
  
  local_8 = ptr;
  std::vector<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>::push_back
            (&this->m_pool,&local_8);
  return;
}

Assistant:

void push(value_ptr ptr) { m_pool.push_back(ptr); }